

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O3

void __thiscall QWidgetLineControl::updateCursorBlinking(QWidgetLineControl *this)

{
  uint uVar1;
  long in_FS_OFFSET;
  QString local_50;
  QRect local_38;
  void *local_28;
  QRect *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicTimer::stop();
  if ((*(ushort *)(this + 0x50) & 0x404) == 0x400) {
    QGuiApplication::styleHints();
    uVar1 = QStyleHints::cursorFlashTime();
    if (1 < (int)uVar1) {
      QBasicTimer::start(this + 0x54,(ulong)(uVar1 >> 1) * 1000000,1,this);
    }
  }
  this[0x51] = (QWidgetLineControl)((byte)this[0x51] | 2);
  inputMask(&local_50,this);
  if (local_50.d.size == 0) {
    local_38 = rectForPos(this,*(int *)(this + 0x40));
  }
  else {
    local_38 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
  }
  local_28 = (void *)0x0;
  local_20 = &local_38;
  QMetaObject::activate((QObject *)this,&staticMetaObject,9,&local_28);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetLineControl::updateCursorBlinking()
{
    m_blinkTimer.stop();

    if (m_blinkEnabled && !m_readOnly) {
        const auto flashTime = QGuiApplication::styleHints()->cursorFlashTime() * 1ms;
        if (flashTime >= 2ms)
            m_blinkTimer.start(flashTime / 2, this);
    }

    m_blinkStatus = 1;
    emit updateNeeded(inputMask().isEmpty() ? cursorRect() : QRect());
}